

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict_main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  ostream *poVar1;
  float fVar2;
  Modifier reset;
  Modifier green;
  Timer timer;
  Solver solver;
  Modifier local_2f8;
  Modifier local_2f4;
  string local_2f0;
  Timer local_2d0;
  undefined1 local_2c0 [608];
  pointer local_60;
  undefined1 local_50 [16];
  Metric *local_40;
  undefined1 local_30 [16];
  pointer local_20;
  
  Timer::Timer(&local_2d0);
  Timer::tic(&local_2d0);
  xLearn::HyperParam::HyperParam((HyperParam *)local_2c0);
  local_2c0._560_8_ = (pointer)0x0;
  local_2c0._568_8_ = (pointer)0x0;
  local_2c0._528_8_ = (pointer)0x0;
  local_2c0._536_8_ = (pointer)0x0;
  local_2c0._544_8_ = (pointer)0x0;
  local_2c0._552_8_ = (pointer)0x0;
  local_2c0._592_16_ = ZEXT416(0) << 0x40;
  local_60 = (pointer)0x0;
  local_20 = (pointer)0x0;
  local_40 = (Metric *)0x0;
  local_2c0[0] = false;
  local_50 = local_2c0._592_16_;
  local_30 = local_2c0._592_16_;
  xLearn::Solver::Initialize((Solver *)local_2c0,argc,argv);
  xLearn::Solver::StartWork((Solver *)local_2c0);
  xLearn::Solver::Clear((Solver *)local_2c0);
  fVar2 = Timer::toc(&local_2d0);
  StringPrintf_abi_cxx11_(&local_2f0,"Total time cost: %.2f (sec)",(double)fVar2);
  local_2f8.code = RESET;
  local_2f4.code = FG_GREEN;
  poVar1 = Color::operator<<((ostream *)&std::cout,&local_2f4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[------------] ",0xf);
  poVar1 = Color::operator<<(poVar1,&local_2f8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  xLearn::Solver::~Solver((Solver *)local_2c0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  Timer timer;
  timer.tic();

  xLearn::Solver solver;
  solver.SetPredict();
  solver.Initialize(argc, argv);
  solver.StartWork();
  solver.Clear();

  Color::print_info(
    StringPrintf("Total time cost: %.2f (sec)", 
    timer.toc()), false);

  return 0;
}